

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O1

status_t tchecker::refdbm::bound_spread(db_t *rdbm,reference_clock_variables_t *r,integer_t spread)

{
  bool bVar1;
  status_t sVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> ref_clocks;
  allocator<unsigned_long> local_41;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_40,(ulong)r->_refcount,0,&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(&local_40);
  sVar2 = bound_spread(rdbm,r,spread,&local_40);
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_40);
  if (bVar1) {
    if (local_40.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return sVar2;
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

enum tchecker::dbm::status_t bound_spread(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                          tchecker::integer_t spread)
{
  boost::dynamic_bitset<> ref_clocks{r.refcount()};
  ref_clocks.set();
  return tchecker::refdbm::bound_spread(rdbm, r, spread, ref_clocks);
}